

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtWriter.cpp
# Opt level: O2

void axl::io::ShmtWriter::copyWriteChain
               (void *_pDst,void **blockArray,size_t *sizeArray,size_t count)

{
  size_t size;
  size_t i;
  size_t sVar1;
  
  for (sVar1 = 0; count != sVar1; sVar1 = sVar1 + 1) {
    size = sizeArray[sVar1];
    __wrap_memcpy(_pDst,blockArray[sVar1],size);
    _pDst = (void *)((long)_pDst + size);
  }
  return;
}

Assistant:

void
ShmtWriter::copyWriteChain(
	void* _pDst,
	const void* const* blockArray,
	const size_t* sizeArray,
	size_t count
) {
	char* dst = (char*)_pDst;

	for (size_t i = 0; i < count; i++) {
		const void* src = blockArray[i];
		size_t size = sizeArray[i];

		memcpy(dst, src, size);
		dst += size;
	}
}